

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void stackjit::TestLibrary::add(VMState *vmState)

{
  initializer_list<const_stackjit::Type_*> __l;
  initializer_list<const_stackjit::Type_*> __l_00;
  TypeProvider *pTVar1;
  Type *pTVar2;
  Type *pTVar3;
  allocator<const_stackjit::Type_*> local_291;
  Type *local_290;
  iterator local_288;
  size_type local_280;
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> local_278;
  allocator local_259;
  string local_258 [32];
  FunctionDefinition local_238;
  allocator local_199;
  string local_198 [32];
  Type *local_178;
  Type *pointType;
  Type *local_168;
  iterator local_160;
  size_type local_158;
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> local_150;
  allocator local_131;
  string local_130 [32];
  FunctionDefinition local_110;
  TypeSystem local_78 [32];
  Type *local_58;
  Type *voidType;
  TypeSystem local_40 [32];
  Type *local_20;
  Type *intType;
  Binder *binder;
  VMState *vmState_local;
  
  binder = (Binder *)vmState;
  intType = (Type *)VMState::binder(vmState);
  pTVar1 = VMState::typeProvider((VMState *)binder);
  TypeSystem::toString_abi_cxx11_(local_40,Integer);
  pTVar2 = TypeProvider::makeType(pTVar1,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  local_20 = pTVar2;
  pTVar1 = VMState::typeProvider((VMState *)binder);
  TypeSystem::toString_abi_cxx11_(local_78,Void);
  pTVar3 = TypeProvider::makeType(pTVar1,(string *)local_78);
  std::__cxx11::string::~string((string *)local_78);
  pTVar2 = intType;
  local_58 = pTVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"rt.test.fib",&local_131);
  local_168 = local_20;
  local_160 = &local_168;
  local_158 = 1;
  std::allocator<const_stackjit::Type_*>::allocator
            ((allocator<const_stackjit::Type_*> *)((long)&pointType + 7));
  __l_00._M_len = local_158;
  __l_00._M_array = local_160;
  std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::vector
            (&local_150,__l_00,(allocator<const_stackjit::Type_*> *)((long)&pointType + 7));
  FunctionDefinition::FunctionDefinition
            (&local_110,(string *)local_130,&local_150,local_20,(BytePtr)fibonacci,(ClassType *)0x0,
             Public,false);
  Binder::define((Binder *)pTVar2,&local_110);
  FunctionDefinition::~FunctionDefinition(&local_110);
  std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::~vector(&local_150);
  std::allocator<const_stackjit::Type_*>::~allocator
            ((allocator<const_stackjit::Type_*> *)((long)&pointType + 7));
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  pTVar1 = VMState::typeProvider((VMState *)binder);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"Ref.Point",&local_199);
  pTVar3 = TypeProvider::makeType(pTVar1,(string *)local_198);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  pTVar2 = intType;
  if (pTVar3 != (Type *)0x0) {
    local_178 = pTVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_258,"rt.test.println",&local_259);
    local_290 = local_178;
    local_288 = &local_290;
    local_280 = 1;
    std::allocator<const_stackjit::Type_*>::allocator(&local_291);
    __l._M_len = local_280;
    __l._M_array = local_288;
    std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::vector
              (&local_278,__l,&local_291);
    FunctionDefinition::FunctionDefinition
              (&local_238,(string *)local_258,&local_278,local_58,(BytePtr)printPoint,
               (ClassType *)0x0,Public,false);
    Binder::define((Binder *)pTVar2,&local_238);
    FunctionDefinition::~FunctionDefinition(&local_238);
    std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::~vector
              (&local_278);
    std::allocator<const_stackjit::Type_*>::~allocator(&local_291);
    std::__cxx11::string::~string(local_258);
    std::allocator<char>::~allocator((allocator<char> *)&local_259);
  }
  return;
}

Assistant:

void TestLibrary::add(VMState& vmState) {
		auto& binder = vmState.binder();
		auto intType = vmState.typeProvider().makeType(TypeSystem::toString(PrimitiveTypes::Integer));
		auto voidType = vmState.typeProvider().makeType(TypeSystem::toString(PrimitiveTypes::Void));

		binder.define(FunctionDefinition("rt.test.fib", { intType }, intType, (BytePtr)(&fibonacci)));

		auto pointType = vmState.typeProvider().makeType("Ref.Point");
		if (pointType != nullptr) {
			binder.define(FunctionDefinition("rt.test.println", { pointType }, voidType, (BytePtr)(&printPoint)));
		}
	}